

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::_solveRealLPAndRecordStatistics
          (SoPlexBase<double> *this,bool *interrupt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Representation RVar4;
  Type TVar5;
  element_type *peVar6;
  SPxSolverBase<double> *this_00;
  SoPlexBase<double> *in_RDI;
  Real RVar7;
  Real RVar8;
  double extraout_XMM0_Qa;
  double dVar9;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  Verbosity old_verbosity_1;
  SPxException *E;
  Verbosity old_verbosity;
  double mintol;
  bool _hadBasis;
  undefined1 in_stack_00000bbf;
  bool *in_stack_00000bc0;
  SPxSolverBase<double> *in_stack_00000bc8;
  undefined4 in_stack_fffffffffffffe78;
  Representation in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  Type in_stack_fffffffffffffe8c;
  undefined1 h;
  SPxSolverBase<double> *in_stack_fffffffffffffe90;
  
  bVar1 = in_RDI->_hasBasis;
  iVar2 = intParam(in_RDI,ITERLIMIT);
  RVar7 = realParam(in_RDI,INFTY);
  if (RVar7 <= (double)iVar2) {
    SPxSolverBase<double>::setTerminationIter(&in_RDI->_solver,-1);
  }
  else {
    iVar2 = intParam(in_RDI,ITERLIMIT);
    SPxSolverBase<double>::setTerminationIter
              (&in_RDI->_solver,iVar2 - in_RDI->_statistics->iterations);
  }
  RVar7 = realParam(in_RDI,TIMELIMIT);
  RVar8 = realParam(in_RDI,INFTY);
  if (RVar8 <= RVar7) {
    RVar7 = realParam(in_RDI,INFTY);
    SPxSolverBase<double>::setTerminationTime(&in_RDI->_solver,RVar7);
  }
  else {
    RVar7 = realParam(in_RDI,TIMELIMIT);
    (*in_RDI->_statistics->solvingTime->_vptr_Timer[6])();
    SPxSolverBase<double>::setTerminationTime(&in_RDI->_solver,RVar7 - extraout_XMM0_Qa);
  }
  dVar9 = SPxSolverBase<double>::epsilon((SPxSolverBase<double> *)0x42078e);
  dVar9 = dVar9 * 10000.0;
  tolerances((SoPlexBase<double> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x4207cd);
  RVar7 = Tolerances::floatingPointFeastol(peVar6);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4207ff);
  if (RVar7 < dVar9) {
    tolerances((SoPlexBase<double> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x420845);
    Tolerances::setFloatingPointFeastol(peVar6,dVar9);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x420865);
  }
  tolerances((SoPlexBase<double> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x4208d7);
  RVar7 = Tolerances::floatingPointOpttol(peVar6);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x420906);
  if (RVar7 < dVar9) {
    tolerances((SoPlexBase<double> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x420943);
    Tolerances::setFloatingPointOpttol(peVar6,dVar9);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x420963);
  }
  iVar2 = intParam(in_RDI,REPRESENTATION);
  if (iVar2 == 1) {
LAB_00420a54:
    RVar4 = SPxSolverBase<double>::rep(&in_RDI->_solver);
    if (RVar4 == COLUMN) goto LAB_00420a8b;
    SPxSolverBase<double>::setRep
              ((SPxSolverBase<double> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe7c);
  }
  else {
    iVar2 = intParam(in_RDI,REPRESENTATION);
    if (iVar2 == 0) {
      iVar2 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x4209fb);
      RVar7 = realParam(in_RDI,REPRESENTATION_SWITCH);
      iVar3 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x420a41);
      if ((double)(iVar3 + 1) <= (double)(iVar2 + 1) * RVar7) goto LAB_00420a54;
    }
LAB_00420a8b:
    iVar2 = intParam(in_RDI,REPRESENTATION);
    if (iVar2 == 2) {
LAB_00420b2e:
      RVar4 = SPxSolverBase<double>::rep(&in_RDI->_solver);
      if (RVar4 != ROW) {
        SPxSolverBase<double>::setRep
                  ((SPxSolverBase<double> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe7c);
      }
    }
    else {
      iVar2 = intParam(in_RDI,REPRESENTATION);
      if (iVar2 == 0) {
        iVar2 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x420ad5);
        RVar7 = realParam(in_RDI,REPRESENTATION_SWITCH);
        iVar3 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x420b1b);
        if ((double)(iVar2 + 1) * RVar7 < (double)(iVar3 + 1)) goto LAB_00420b2e;
      }
    }
  }
  iVar2 = intParam(in_RDI,ALGORITHM);
  if ((((iVar2 == 0) && (RVar4 = SPxSolverBase<double>::rep(&in_RDI->_solver), RVar4 == COLUMN)) ||
      ((iVar2 = intParam(in_RDI,ALGORITHM), iVar2 == 1 &&
       (RVar4 = SPxSolverBase<double>::rep(&in_RDI->_solver), RVar4 == ROW)))) &&
     (TVar5 = SPxSolverBase<double>::type(&in_RDI->_solver), TVar5 != ENTER)) {
    SPxSolverBase<double>::setType(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    h = (undefined1)((uint)in_stack_fffffffffffffe8c >> 0x18);
  }
  else {
    iVar2 = intParam(in_RDI,ALGORITHM);
    if ((((iVar2 == 1) && (RVar4 = SPxSolverBase<double>::rep(&in_RDI->_solver), RVar4 == COLUMN))
        || ((iVar2 = intParam(in_RDI,ALGORITHM), iVar2 == 0 &&
            (RVar4 = SPxSolverBase<double>::rep(&in_RDI->_solver), RVar4 == ROW)))) &&
       (TVar5 = SPxSolverBase<double>::type(&in_RDI->_solver), TVar5 != LEAVE)) {
      SPxSolverBase<double>::setType(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    }
    h = (undefined1)((uint)in_stack_fffffffffffffe8c >> 0x18);
  }
  RVar7 = realParam(in_RDI,SPARSITY_THRESHOLD);
  SPxSolverBase<double>::setSparsePricingFactor(&in_RDI->_solver,RVar7);
  iVar2 = intParam(in_RDI,HYPER_PRICING);
  if (iVar2 == 2) {
LAB_00420d20:
    SPxSolverBase<double>::hyperPricing(in_stack_fffffffffffffe90,(bool)h);
  }
  else {
    iVar2 = intParam(in_RDI,HYPER_PRICING);
    if (iVar2 == 1) {
      iVar2 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x420cf9);
      iVar3 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x420d11);
      if (5000 < iVar2 + iVar3) goto LAB_00420d20;
    }
    iVar2 = intParam(in_RDI,HYPER_PRICING);
    if (iVar2 == 0) {
      SPxSolverBase<double>::hyperPricing(in_stack_fffffffffffffe90,(bool)h);
    }
  }
  this_00 = &in_RDI->_solver;
  RVar7 = realParam(in_RDI,REFAC_BASIS_NNZ);
  SPxSolverBase<double>::setNonzeroFactor(this_00,RVar7);
  RVar7 = realParam(in_RDI,REFAC_UPDATE_FILL);
  SPxSolverBase<double>::setFillFactor(this_00,RVar7);
  RVar7 = realParam(in_RDI,REFAC_MEM_FACTOR);
  SPxSolverBase<double>::setMemFactor(this_00,RVar7);
  (*in_RDI->_statistics->simplexTime->_vptr_Timer[3])();
  SPxSolverBase<double>::solve(in_stack_00000bc8,in_stack_00000bc0,(bool)in_stack_00000bbf);
  (*in_RDI->_statistics->simplexTime->_vptr_Timer[4])();
  iVar2 = SPxSolverBase<double>::iterations((SPxSolverBase<double> *)0x4210a2);
  if (0 < iVar2) {
    SLUFactorRational::clear
              ((SLUFactorRational *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  }
  iVar2 = SPxSolverBase<double>::iterations((SPxSolverBase<double> *)0x4210dd);
  in_RDI->_statistics->iterations = iVar2 + in_RDI->_statistics->iterations;
  iVar2 = SPxSolverBase<double>::primalIterations
                    ((SPxSolverBase<double> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  in_RDI->_statistics->iterationsPrimal = iVar2 + in_RDI->_statistics->iterationsPrimal;
  if ((bVar1 & 1U) == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = SPxSolverBase<double>::iterations((SPxSolverBase<double> *)0x42113b);
  }
  in_RDI->_statistics->iterationsFromBasis = iVar2 + in_RDI->_statistics->iterationsFromBasis;
  iVar3 = SPxSolverBase<double>::polishIterations(&in_RDI->_solver);
  in_RDI->_statistics->iterationsPolish = iVar3 + in_RDI->_statistics->iterationsPolish;
  iVar3 = SPxSolverBase<double>::boundFlips(&in_RDI->_solver);
  in_RDI->_statistics->boundflips = iVar3 + in_RDI->_statistics->boundflips;
  (*((in_RDI->_solver).multTimeSparse)->_vptr_Timer[6])();
  in_RDI->_statistics->multTimeSparse = extraout_XMM0_Qa_00 + in_RDI->_statistics->multTimeSparse;
  (*((in_RDI->_solver).multTimeFull)->_vptr_Timer[6])();
  in_RDI->_statistics->multTimeFull = extraout_XMM0_Qa_01 + in_RDI->_statistics->multTimeFull;
  (*((in_RDI->_solver).multTimeColwise)->_vptr_Timer[6])();
  in_RDI->_statistics->multTimeColwise = extraout_XMM0_Qa_02 + in_RDI->_statistics->multTimeColwise;
  (*((in_RDI->_solver).multTimeUnsetup)->_vptr_Timer[6])();
  in_RDI->_statistics->multTimeUnsetup = extraout_XMM0_Qa_03 + in_RDI->_statistics->multTimeUnsetup;
  in_RDI->_statistics->multSparseCalls =
       (in_RDI->_solver).multSparseCalls + in_RDI->_statistics->multSparseCalls;
  in_RDI->_statistics->multFullCalls =
       (in_RDI->_solver).multFullCalls + in_RDI->_statistics->multFullCalls;
  in_RDI->_statistics->multColwiseCalls =
       (in_RDI->_solver).multColwiseCalls + in_RDI->_statistics->multColwiseCalls;
  in_RDI->_statistics->multUnsetupCalls =
       (in_RDI->_solver).multUnsetupCalls + in_RDI->_statistics->multUnsetupCalls;
  RVar7 = SLUFactor<double>::getFactorTime((SLUFactor<double> *)0x4212a1);
  in_RDI->_statistics->luFactorizationTimeReal =
       RVar7 + in_RDI->_statistics->luFactorizationTimeReal;
  RVar7 = SLUFactor<double>::getSolveTime((SLUFactor<double> *)0x4212c9);
  in_RDI->_statistics->luSolveTimeReal = RVar7 + in_RDI->_statistics->luSolveTimeReal;
  iVar3 = SLUFactor<double>::getFactorCount(&in_RDI->_slufactor);
  in_RDI->_statistics->luFactorizationsReal = iVar3 + in_RDI->_statistics->luFactorizationsReal;
  iVar3 = SLUFactor<double>::getSolveCount(&in_RDI->_slufactor);
  in_RDI->_statistics->luSolvesReal = iVar3 + in_RDI->_statistics->luSolvesReal;
  SLUFactor<double>::resetCounters((SLUFactor<double> *)CONCAT44(iVar2,in_stack_fffffffffffffe80));
  iVar3 = SPxSolverBase<double>::primalDegeneratePivots
                    ((SPxSolverBase<double> *)CONCAT44(iVar2,in_stack_fffffffffffffe80));
  in_RDI->_statistics->degenPivotsPrimal = iVar3 + in_RDI->_statistics->degenPivotsPrimal;
  iVar2 = SPxSolverBase<double>::dualDegeneratePivots
                    ((SPxSolverBase<double> *)CONCAT44(iVar2,in_stack_fffffffffffffe80));
  in_RDI->_statistics->degenPivotsDual = iVar2 + in_RDI->_statistics->degenPivotsDual;
  dVar9 = SPxSolverBase<double>::sumDualDegeneracy(&in_RDI->_solver);
  in_RDI->_statistics->sumDualDegen = dVar9 + in_RDI->_statistics->sumDualDegen;
  dVar9 = SPxSolverBase<double>::sumPrimalDegeneracy(&in_RDI->_solver);
  in_RDI->_statistics->sumPrimalDegen = dVar9 + in_RDI->_statistics->sumPrimalDegen;
  return;
}

Assistant:

void SoPlexBase<R>::_solveRealLPAndRecordStatistics(volatile bool* interrupt)
{
   bool _hadBasis = _hasBasis;

   // set time and iteration limit
   if(intParam(SoPlexBase<R>::ITERLIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationIter(intParam(SoPlexBase<R>::ITERLIMIT) - _statistics->iterations);
   else
      _solver.setTerminationIter(-1);

   if(realParam(SoPlexBase<R>::TIMELIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::TIMELIMIT)) -
                                 _statistics->solvingTime->time());
   else
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::INFTY)));

   // ensure that tolerances are not too small
   R mintol = 1e4 * _solver.epsilon();

   if(this->tolerances()->floatingPointFeastol() < mintol)
      this->tolerances()->setFloatingPointFeastol(Real(mintol));

   if(this->tolerances()->floatingPointOpttol() < mintol)
      this->tolerances()->setFloatingPointOpttol(Real(mintol));

   // set correct representation
   if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_COLUMN
         || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
             && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) >=
             (_solver.nRows() + 1)))
         && _solver.rep() != SPxSolverBase<R>::COLUMN)
   {
      _solver.setRep(SPxSolverBase<R>::COLUMN);
   }
   else if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
           && _solver.rep() != SPxSolverBase<R>::ROW)
   {
      _solver.setRep(SPxSolverBase<R>::ROW);
   }

   // set correct type
   if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
         && _solver.rep() == SPxSolverBase<R>::COLUMN)
         || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL && _solver.rep() == SPxSolverBase<R>::ROW))
         && _solver.type() != SPxSolverBase<R>::ENTER)
   {
      _solver.setType(SPxSolverBase<R>::ENTER);
   }
   else if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL
             && _solver.rep() == SPxSolverBase<R>::COLUMN)
            || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
                && _solver.rep() == SPxSolverBase<R>::ROW))
           && _solver.type() != SPxSolverBase<R>::LEAVE)
   {
      _solver.setType(SPxSolverBase<R>::LEAVE);
   }

   // set pricing modes
   _solver.setSparsePricingFactor(realParam(SoPlexBase<R>::SPARSITY_THRESHOLD));

   if((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_ON)
         || ((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_AUTO)
             && (_solver.nRows() + _solver.nCols() > SOPLEX_HYPERPRICINGTHRESHOLD)))
      _solver.hyperPricing(true);
   else if(intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_OFF)
      _solver.hyperPricing(false);

   _solver.setNonzeroFactor(realParam(SoPlexBase<R>::REFAC_BASIS_NNZ));
   _solver.setFillFactor(realParam(SoPlexBase<R>::REFAC_UPDATE_FILL));
   _solver.setMemFactor(realParam(SoPlexBase<R>::REFAC_MEM_FACTOR));

   // call floating-point solver and catch exceptions
   _statistics->simplexTime->start();

   try
   {
      _solver.solve(interrupt);
   }
   catch(const SPxException& E)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() << "> while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }
   catch(...)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught unknown exception while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }

   _statistics->simplexTime->stop();

   // invalidate rational factorization of basis if pivots have been performed
   if(_solver.iterations() > 0)
      _rationalLUSolver.clear();

   // record statistics
   _statistics->iterations += _solver.iterations();
   _statistics->iterationsPrimal += _solver.primalIterations();
   _statistics->iterationsFromBasis += _hadBasis ? _solver.iterations() : 0;
   _statistics->iterationsPolish += _solver.polishIterations();
   _statistics->boundflips += _solver.boundFlips();
   _statistics->multTimeSparse += _solver.multTimeSparse->time();
   _statistics->multTimeFull += _solver.multTimeFull->time();
   _statistics->multTimeColwise += _solver.multTimeColwise->time();
   _statistics->multTimeUnsetup += _solver.multTimeUnsetup->time();
   _statistics->multSparseCalls += _solver.multSparseCalls;
   _statistics->multFullCalls += _solver.multFullCalls;
   _statistics->multColwiseCalls += _solver.multColwiseCalls;
   _statistics->multUnsetupCalls += _solver.multUnsetupCalls;
   _statistics->luFactorizationTimeReal += _slufactor.getFactorTime();
   _statistics->luSolveTimeReal += _slufactor.getSolveTime();
   _statistics->luFactorizationsReal += _slufactor.getFactorCount();
   _statistics->luSolvesReal += _slufactor.getSolveCount();
   _slufactor.resetCounters();

   _statistics->degenPivotsPrimal += _solver.primalDegeneratePivots();
   _statistics->degenPivotsDual += _solver.dualDegeneratePivots();
   _statistics->sumDualDegen += _solver.sumDualDegeneracy();
   _statistics->sumPrimalDegen += _solver.sumPrimalDegeneracy();
}